

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Shutdown(ImGuiContext *context)

{
  ImVector<ImGuiWindow_*> *this;
  ImVector<ImGuiViewportP_*> *this_00;
  ImVector<ImGuiTableTempData> *this_01;
  ImFontAtlas *p;
  char *ini_filename;
  ImFileHandle f;
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiViewportP **ppIVar3;
  ImGuiTableTempData *this_02;
  int i;
  int iVar4;
  
  p = (context->IO).Fonts;
  if ((p != (ImFontAtlas *)0x0) && (context->FontAtlasOwnedByContext == true)) {
    p->Locked = false;
    IM_DELETE<ImFontAtlas>(p);
  }
  (context->IO).Fonts = (ImFontAtlas *)0x0;
  pIVar1 = GImGui;
  if (context->Initialized == true) {
    if ((context->SettingsLoaded == true) &&
       (ini_filename = (context->IO).IniFilename, ini_filename != (char *)0x0)) {
      GImGui = context;
      SaveIniSettingsToDisk(ini_filename);
    }
    GImGui = pIVar1;
    CallContextHooks(context,ImGuiContextHookType_Shutdown);
    this = &context->Windows;
    for (iVar4 = 0; iVar4 < this->Size; iVar4 = iVar4 + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,iVar4);
      IM_DELETE<ImGuiWindow>(*ppIVar2);
    }
    ImVector<ImGuiWindow_*>::clear(this);
    ImVector<ImGuiWindow_*>::clear(&context->WindowsFocusOrder);
    ImVector<ImGuiWindow_*>::clear(&context->WindowsTempSortBuffer);
    context->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindow_*>::clear(&context->CurrentWindowStack);
    ImVector<ImGuiStorage::ImGuiStoragePair>::clear(&(context->WindowsById).Data);
    context->NavWindow = (ImGuiWindow *)0x0;
    context->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    context->ActiveIdWindow = (ImGuiWindow *)0x0;
    context->HoveredWindow = (ImGuiWindow *)0x0;
    context->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    context->MovingWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiColorMod>::clear(&context->ColorStack);
    ImVector<ImGuiStyleMod>::clear(&context->StyleVarStack);
    ImVector<ImFont_*>::clear(&context->FontStack);
    ImVector<ImGuiPopupData>::clear(&context->OpenPopupStack);
    ImVector<ImGuiPopupData>::clear(&context->BeginPopupStack);
    this_00 = &context->Viewports;
    for (iVar4 = 0; iVar4 < this_00->Size; iVar4 = iVar4 + 1) {
      ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](this_00,iVar4);
      IM_DELETE<ImGuiViewportP>(*ppIVar3);
    }
    ImVector<ImGuiViewportP_*>::clear(this_00);
    ImPool<ImGuiTabBar>::Clear(&context->TabBars);
    ImVector<ImGuiPtrOrIndex>::clear(&context->CurrentTabBarStack);
    ImVector<ImGuiShrinkWidthItem>::clear(&context->ShrinkWidthBuffer);
    ImPool<ImGuiTable>::Clear(&context->Tables);
    this_01 = &context->TablesTempDataStack;
    for (iVar4 = 0; iVar4 < this_01->Size; iVar4 = iVar4 + 1) {
      this_02 = ImVector<ImGuiTableTempData>::operator[](this_01,iVar4);
      ImGuiTableTempData::~ImGuiTableTempData(this_02);
    }
    ImVector<ImGuiTableTempData>::clear(this_01);
    ImVector<ImDrawChannel>::clear(&context->DrawChannelsTempMergeBuffer);
    ImVector<char>::clear(&context->ClipboardHandlerData);
    ImVector<unsigned_int>::clear(&context->MenusIdSubmittedThisFrame);
    ImGuiInputTextState::ClearFreeMemory(&context->InputTextState);
    ImVector<char>::clear(&(context->SettingsWindows).Buf);
    ImVector<ImGuiSettingsHandler>::clear(&context->SettingsHandlers);
    f = context->LogFile;
    if (f != (ImFileHandle)0x0) {
      if (f != _stdout) {
        ImFileClose(f);
      }
      context->LogFile = (ImFileHandle)0x0;
    }
    ImVector<char>::clear(&(context->LogBuffer).Buf);
    context->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(&g);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorStack.clear();
    g.StyleVarStack.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    for (int i = 0; i < g.Viewports.Size; i++)
        IM_DELETE(g.Viewports[i]);
    g.Viewports.clear();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.Tables.Clear();
    for (int i = 0; i < g.TablesTempDataStack.Size; i++)
        g.TablesTempDataStack[i].~ImGuiTableTempData();
    g.TablesTempDataStack.clear();
    g.DrawChannelsTempMergeBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}